

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_surf(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  char buffer [1024];
  int local_100;
  REF_INT dummy;
  REF_INT new_qua;
  REF_INT qua;
  REF_INT nodes [27];
  int local_80;
  int local_7c;
  REF_INT new_tri;
  REF_INT tri;
  REF_DBL xyz [3];
  int local_58;
  REF_INT new_node;
  REF_INT node;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    ref_cell = *(REF_CELL *)&ref_node->blank;
    _ntri = fopen((char *)ref_grid,"r");
    if (_ntri == (FILE *)0x0) {
      printf("unable to open %s\n",ref_grid);
    }
    if (_ntri == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x192,"ref_import_surf","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      iVar2 = __isoc99_fscanf(_ntri,"%d",&node);
      if (iVar2 == 1) {
        iVar2 = __isoc99_fscanf(_ntri,"%d",&new_node);
        if (iVar2 == 1) {
          iVar2 = __isoc99_fscanf(_ntri,"%d",&nqua);
          if (iVar2 == 1) {
            for (local_58 = 0; local_58 < nqua; local_58 = local_58 + 1) {
              uVar1 = ref_node_add((REF_NODE)ref_cell,(long)local_58,(REF_INT *)((long)xyz + 0x14));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x199,"ref_import_surf",(ulong)uVar1,"new_node");
                return uVar1;
              }
              if (local_58 != xyz[2]._4_4_) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x19a,"ref_import_surf","node index");
                return 1;
              }
              iVar2 = __isoc99_fscanf(_ntri,"%lf",&new_tri);
              if (iVar2 != 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x19b,"ref_import_surf","x");
                return 1;
              }
              iVar2 = __isoc99_fscanf(_ntri,"%lf",xyz);
              if (iVar2 != 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x19c,"ref_import_surf","y");
                return 1;
              }
              iVar2 = __isoc99_fscanf(_ntri,"%lf",xyz + 1);
              if (iVar2 != 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x19d,"ref_import_surf","z");
                return 1;
              }
              *(undefined8 *)(ref_cell->c2n + (long)(xyz[2]._4_4_ * 0xf) * 2) = _new_tri;
              *(REF_DBL *)(ref_cell->c2n + (long)(xyz[2]._4_4_ * 0xf + 1) * 2) = xyz[0];
              *(REF_DBL *)(ref_cell->c2n + (long)(xyz[2]._4_4_ * 0xf + 2) * 2) = xyz[1];
              fgets((char *)&ref_private_macro_code_rss_1,0x400,_ntri);
            }
            uVar1 = ref_node_initialize_n_global((REF_NODE)ref_cell,(long)nqua);
            if (uVar1 == 0) {
              file = (FILE *)ref_node->part;
              nodes[1] = -1;
              for (local_7c = 0; local_7c < node; local_7c = local_7c + 1) {
                for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_58);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x1aa,"ref_import_surf","tri");
                    return 1;
                  }
                }
                for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",buffer + 0x3fc);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x1ac,"ref_import_surf","extra 0 1");
                    return 1;
                  }
                }
                new_qua = new_qua + -1;
                qua = qua + -1;
                nodes[0] = nodes[0] + -1;
                uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&local_80);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x1b0,"ref_import_surf",(ulong)uVar1,"new tri");
                  return uVar1;
                }
                if (local_7c != local_80) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x1b1,"ref_import_surf","tri index");
                  return 1;
                }
              }
              file = *(FILE **)&ref_node->naux;
              nodes[2] = -1;
              for (dummy = 0; dummy < new_node; dummy = dummy + 1) {
                for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_58);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x1b8,"ref_import_surf","qua");
                    return 1;
                  }
                }
                for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",buffer + 0x3fc);
                  if (iVar2 != 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x1ba,"ref_import_surf","extra 0 1");
                    return 1;
                  }
                }
                new_qua = new_qua + -1;
                qua = qua + -1;
                nodes[0] = nodes[0] + -1;
                nodes[1] = nodes[1] + -1;
                uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&local_100);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x1bf,"ref_import_surf",(ulong)uVar1,"new qua");
                  return uVar1;
                }
                if (dummy != local_100) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x1c0,"ref_import_surf","qua index");
                  return 1;
                }
              }
              fclose(_ntri);
              ref_grid_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x1a4,"ref_import_surf",(ulong)uVar1,"init glob");
              ref_grid_ptr_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x196,"ref_import_surf","nnode");
            ref_grid_ptr_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x195,"ref_import_surf","nqua");
          ref_grid_ptr_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x194,"ref_import_surf","ntri");
        ref_grid_ptr_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x18c,
           "ref_import_surf",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_surf(REF_GRID *ref_grid_ptr,
                                          REF_MPI ref_mpi,
                                          const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua;
  REF_INT node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua, new_qua;
  REF_INT dummy;
  char buffer[1024];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &nnode), "nnode");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
    fgets(buffer, sizeof(buffer), file);
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    for (node = 0; node < 2; node++)
      RES(1, fscanf(file, "%d", &(dummy)), "extra 0 1");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 5; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
    for (node = 0; node < 2; node++)
      RES(1, fscanf(file, "%d", &(dummy)), "extra 0 1");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  fclose(file);

  return REF_SUCCESS;
}